

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

void ncnn::softmax(float *_ptr,int size)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  lVar1 = 0;
  if (size < 1) {
    size = 0;
  }
  fVar3 = -3.4028235e+38;
  for (; size != (int)lVar1; lVar1 = lVar1 + 1) {
    if (fVar3 <= _ptr[lVar1]) {
      fVar3 = _ptr[lVar1];
    }
  }
  fVar4 = 0.0;
  for (lVar1 = 0; size != (int)lVar1; lVar1 = lVar1 + 1) {
    fVar2 = expf(_ptr[lVar1] - fVar3);
    _ptr[lVar1] = fVar2;
    fVar4 = fVar4 + fVar2;
  }
  for (lVar1 = 0; size != (int)lVar1; lVar1 = lVar1 + 1) {
    _ptr[lVar1] = _ptr[lVar1] * (1.0 / fVar4);
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int size)
{
    // reduce max
    float max = -FLT_MAX;
    {
        const float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            max = std::max(max, *ptr++);
        }
    }

    // reduce exp(x - max)
    float sum = 0.f;
    {
        float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            *ptr = expf(*ptr - max);
            sum += *ptr;
            ptr++;
        }
    }

    // div sum
    {
        float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            *ptr++ /= sum;
        }
    }
}